

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O2

int anon_unknown.dwarf_7357::RtMidi_getapiname(lua_State *L)

{
  uint uVar1;
  Api api;
  string str;
  
  uVar1 = luaL_checkinteger(L,1);
  RtMidi::getApiName_abi_cxx11_(&str,(RtMidi *)(ulong)uVar1,api);
  lua_pushlstring(L,str._M_dataplus._M_p,str._M_string_length);
  std::__cxx11::string::~string((string *)&str);
  return 1;
}

Assistant:

int RtMidi_getapiname(lua_State *L) {
	auto api = static_cast<RtMidi::Api>(luaL_checkinteger(L, 1));
	auto str = RtMidi::getApiName(api);
	lua_pushlstring(L, str.c_str(), str.size());
	return 1;
}